

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerServer.cpp
# Opt level: O0

void __thiscall helics::apps::BrokerServer::closeServers(BrokerServer *this)

{
  bool bVar1;
  element_type *peVar2;
  __normal_iterator<std::shared_ptr<helics::apps::TypedBrokerServer>_*,_std::vector<std::shared_ptr<helics::apps::TypedBrokerServer>,_std::allocator<std::shared_ptr<helics::apps::TypedBrokerServer>_>_>_>
  *in_RDI;
  shared_ptr<helics::apps::TypedBrokerServer> *server;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<helics::apps::TypedBrokerServer>,_std::allocator<std::shared_ptr<helics::apps::TypedBrokerServer>_>_>
  *__range2;
  vector<std::shared_ptr<helics::apps::TypedBrokerServer>,_std::allocator<std::shared_ptr<helics::apps::TypedBrokerServer>_>_>
  *in_stack_ffffffffffffffc8;
  __normal_iterator<std::shared_ptr<helics::apps::TypedBrokerServer>_*,_std::vector<std::shared_ptr<helics::apps::TypedBrokerServer>,_std::allocator<std::shared_ptr<helics::apps::TypedBrokerServer>_>_>_>
  local_18;
  __normal_iterator<std::shared_ptr<helics::apps::TypedBrokerServer>_*,_std::vector<std::shared_ptr<helics::apps::TypedBrokerServer>,_std::allocator<std::shared_ptr<helics::apps::TypedBrokerServer>_>_>_>
  *local_10;
  
  local_10 = in_RDI + 1;
  local_18._M_current =
       (shared_ptr<helics::apps::TypedBrokerServer> *)
       CLI::std::
       vector<std::shared_ptr<helics::apps::TypedBrokerServer>,_std::allocator<std::shared_ptr<helics::apps::TypedBrokerServer>_>_>
       ::begin(in_stack_ffffffffffffffc8);
  CLI::std::
  vector<std::shared_ptr<helics::apps::TypedBrokerServer>,_std::allocator<std::shared_ptr<helics::apps::TypedBrokerServer>_>_>
  ::end(in_stack_ffffffffffffffc8);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<std::shared_ptr<helics::apps::TypedBrokerServer>_*,_std::vector<std::shared_ptr<helics::apps::TypedBrokerServer>,_std::allocator<std::shared_ptr<helics::apps::TypedBrokerServer>_>_>_>
                      (in_RDI,(__normal_iterator<std::shared_ptr<helics::apps::TypedBrokerServer>_*,_std::vector<std::shared_ptr<helics::apps::TypedBrokerServer>,_std::allocator<std::shared_ptr<helics::apps::TypedBrokerServer>_>_>_>
                               *)in_stack_ffffffffffffffc8);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<helics::apps::TypedBrokerServer>_*,_std::vector<std::shared_ptr<helics::apps::TypedBrokerServer>,_std::allocator<std::shared_ptr<helics::apps::TypedBrokerServer>_>_>_>
    ::operator*(&local_18);
    peVar2 = CLI::std::
             __shared_ptr_access<helics::apps::TypedBrokerServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<helics::apps::TypedBrokerServer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1e7cda);
    (*peVar2->_vptr_TypedBrokerServer[3])();
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<helics::apps::TypedBrokerServer>_*,_std::vector<std::shared_ptr<helics::apps::TypedBrokerServer>,_std::allocator<std::shared_ptr<helics::apps::TypedBrokerServer>_>_>_>
    ::operator++(&local_18);
  }
  CLI::std::
  vector<std::shared_ptr<helics::apps::TypedBrokerServer>,_std::allocator<std::shared_ptr<helics::apps::TypedBrokerServer>_>_>
  ::clear((vector<std::shared_ptr<helics::apps::TypedBrokerServer>,_std::allocator<std::shared_ptr<helics::apps::TypedBrokerServer>_>_>
           *)0x1e7cfd);
  return;
}

Assistant:

void BrokerServer::closeServers()
{
    for (auto& server : servers) {
        server->stopServer();
    }
    servers.clear();
}